

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_lda_inc.c
# Opt level: O2

void work_lda_exc_pol(xc_func_type *p,size_t np,double *rho,xc_lda_out_params *out)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double local_f8;
  double local_d8;
  double local_70;
  
  local_70 = 0.0;
  for (sVar6 = 0; np != sVar6; sVar6 = sVar6 + 1) {
    lVar5 = (long)(p->dim).rho * sVar6;
    dVar16 = rho[lVar5];
    if (p->nspin == 2) {
      dVar16 = dVar16 + rho[lVar5 + 1];
    }
    dVar35 = p->dens_threshold;
    if (dVar35 <= dVar16) {
      if ((p->nspin == 2) && (local_70 = rho[lVar5 + 1], rho[lVar5 + 1] <= dVar35)) {
        local_70 = dVar35;
      }
      dVar16 = rho[lVar5];
      if (rho[lVar5] <= dVar35) {
        dVar16 = dVar35;
      }
      dVar8 = cbrt(0.3183098861837907);
      dVar9 = dVar8 * 1.4422495703074083 * 2.519842099789747;
      dVar17 = dVar16 - local_70;
      dVar16 = dVar16 + local_70;
      dVar20 = (1.0 / dVar16) * dVar17;
      dVar21 = dVar20 + 1.0;
      dVar35 = p->zeta_threshold;
      dVar10 = cbrt(dVar35);
      dVar11 = cbrt(dVar21);
      local_d8 = dVar35 * dVar10;
      dVar12 = local_d8;
      if (dVar35 < dVar21) {
        dVar12 = dVar11 * dVar21;
      }
      dVar13 = cbrt(dVar16);
      dVar14 = cbrt(9.0);
      dVar14 = dVar14 * dVar14 * dVar8 * dVar8 * p->cam_omega;
      dVar22 = (1.0 / dVar13) * 1.4422495703074083;
      dVar35 = ((1.0 / (double)(-(ulong)(dVar21 <= dVar35) & (ulong)dVar10 |
                               ~-(ulong)(dVar21 <= dVar35) & (ulong)dVar11)) * dVar22 * dVar14) /
               18.0;
      dVar11 = 1.92;
      if (dVar35 <= 1.92) {
        dVar11 = dVar35;
      }
      dVar21 = atan2(1.0,dVar11);
      dVar15 = log(1.0 / (dVar11 * dVar11) + 1.0);
      if (1.92 <= dVar35) {
        if (dVar35 <= 1.92) {
          dVar35 = 1.92;
        }
        dVar35 = dVar35 * dVar35;
        dVar21 = dVar35 * dVar35;
        dVar11 = dVar21 * dVar21;
        auVar28._0_8_ = dVar21 * dVar35;
        dVar15 = dVar11 * dVar11;
        auVar34._0_8_ = dVar11 * dVar35;
        auVar34._8_8_ = dVar21 * dVar11;
        auVar38._0_8_ = auVar28._0_8_ * dVar11;
        auVar38._8_8_ = dVar15;
        auVar24 = divpd(_DAT_00f48900,auVar38);
        uVar27 = auVar24._8_8_;
        auVar30._8_8_ = uVar27;
        auVar30._0_8_ = uVar27;
        auVar36._8_8_ = uVar27;
        auVar36._0_8_ = uVar27;
        auVar39._8_8_ = uVar27;
        auVar39._0_8_ = uVar27;
        auVar33 = divpd(auVar30,auVar34);
        auVar38 = divpd(auVar24,_DAT_00f61f30);
        auVar19._8_8_ = dVar21;
        auVar19._0_8_ = dVar35;
        auVar24 = divpd(auVar36,auVar19);
        auVar36 = divpd(auVar24,_DAT_00f61f40);
        auVar28._8_8_ = dVar11;
        auVar24 = divpd(auVar39,auVar28);
        auVar39 = divpd(auVar24,_DAT_00f61f50);
        auVar30 = divpd(auVar33,_DAT_00f61f60);
        auVar41._8_8_ = 0x3ff0000000000000;
        auVar41._0_8_ = uVar27;
        auVar24._8_8_ = dVar15 * dVar15;
        auVar24._0_8_ = dVar11 * auVar28._0_8_;
        auVar24 = divpd(auVar41,auVar24);
        auVar23._8_8_ = auVar24._8_8_;
        auVar24 = divpd(auVar24,_DAT_00f61f70);
        auVar23._0_8_ = auVar23._8_8_;
        auVar33._8_8_ = dVar21;
        auVar33._0_8_ = dVar35;
        auVar19 = divpd(auVar23,auVar33);
        auVar19 = divpd(auVar19,_DAT_00f61f80);
        local_f8 = ((((((((((((1.0 / auVar34._8_8_) / -364.0 +
                              (1.0 / auVar34._0_8_) / 231.0 +
                              (1.0 / dVar11) / -135.0 +
                              (1.0 / auVar28._0_8_) / 70.0 +
                              (1.0 / dVar21) / -30.0 + (1.0 / dVar35) / 9.0 + auVar38._0_8_) -
                            auVar38._8_8_) + auVar36._0_8_) - auVar36._8_8_) + auVar39._0_8_) -
                        auVar39._8_8_) + auVar30._0_8_) - auVar30._8_8_) + auVar24._0_8_) -
                    auVar24._8_8_) + auVar19._0_8_) - auVar19._8_8_;
      }
      else {
        local_f8 = (dVar21 + (1.0 - dVar15 * (dVar11 * dVar11 + 3.0)) * dVar11 * 0.25) *
                   -2.6666666666666665 * dVar11 + 1.0;
      }
      dVar20 = 1.0 - dVar20;
      dVar35 = p->zeta_threshold;
      dVar11 = cbrt(dVar20);
      if (dVar35 < dVar20) {
        local_d8 = dVar20 * dVar11;
      }
      uVar7 = -(ulong)(dVar20 <= dVar35);
      dVar35 = (dVar14 * dVar22 * (1.0 / (double)(uVar7 & (ulong)dVar10 | ~uVar7 & (ulong)dVar11)))
               / 18.0;
      dVar10 = 1.92;
      if (dVar35 <= 1.92) {
        dVar10 = dVar35;
      }
      dVar11 = atan2(1.0,dVar10);
      dVar20 = log(1.0 / (dVar10 * dVar10) + 1.0);
      if (1.92 <= dVar35) {
        if (dVar35 <= 1.92) {
          dVar35 = 1.92;
        }
        dVar35 = dVar35 * dVar35;
        dVar11 = dVar35 * dVar35;
        dVar10 = dVar11 * dVar11;
        auVar29._0_8_ = dVar11 * dVar35;
        dVar20 = dVar10 * dVar10;
        auVar18._0_8_ = dVar10 * dVar35;
        auVar18._8_8_ = dVar11 * dVar10;
        auVar31._0_8_ = auVar29._0_8_ * dVar10;
        auVar31._8_8_ = dVar20;
        auVar24 = divpd(_DAT_00f48900,auVar31);
        uVar27 = auVar24._8_8_;
        auVar32._8_8_ = uVar27;
        auVar32._0_8_ = uVar27;
        auVar37._8_8_ = uVar27;
        auVar37._0_8_ = uVar27;
        auVar40._8_8_ = uVar27;
        auVar40._0_8_ = uVar27;
        auVar33 = divpd(auVar32,auVar18);
        auVar19 = divpd(auVar24,_DAT_00f61f30);
        auVar3._8_8_ = dVar11;
        auVar3._0_8_ = dVar35;
        auVar24 = divpd(auVar37,auVar3);
        auVar38 = divpd(auVar24,_DAT_00f61f40);
        auVar29._8_8_ = dVar10;
        auVar24 = divpd(auVar40,auVar29);
        auVar41 = divpd(auVar24,_DAT_00f61f50);
        auVar34 = divpd(auVar33,_DAT_00f61f60);
        auVar25._8_8_ = 0x3ff0000000000000;
        auVar25._0_8_ = uVar27;
        auVar2._8_8_ = dVar20 * dVar20;
        auVar2._0_8_ = dVar10 * auVar29._0_8_;
        auVar24 = divpd(auVar25,auVar2);
        auVar26._8_8_ = auVar24._8_8_;
        auVar24 = divpd(auVar24,_DAT_00f61f70);
        auVar26._0_8_ = auVar26._8_8_;
        auVar4._8_8_ = dVar11;
        auVar4._0_8_ = dVar35;
        auVar33 = divpd(auVar26,auVar4);
        auVar33 = divpd(auVar33,_DAT_00f61f80);
        dVar35 = ((((((((((((1.0 / auVar18._8_8_) / -364.0 +
                            (1.0 / auVar18._0_8_) / 231.0 +
                            (1.0 / dVar10) / -135.0 +
                            (1.0 / auVar29._0_8_) / 70.0 +
                            (1.0 / dVar11) / -30.0 + (1.0 / dVar35) / 9.0 + auVar19._0_8_) -
                          auVar19._8_8_) + auVar38._0_8_) - auVar38._8_8_) + auVar41._0_8_) -
                      auVar41._8_8_) + auVar34._0_8_) - auVar34._8_8_) + auVar24._0_8_) -
                  auVar24._8_8_) + auVar33._0_8_) - auVar33._8_8_;
      }
      else {
        dVar35 = (dVar11 + (1.0 - dVar20 * (dVar10 * dVar10 + 3.0)) * dVar10 * 0.25) *
                 -2.6666666666666665 * dVar10 + 1.0;
      }
      dVar20 = dVar8 * 1.4422495703074083 * (1.0 / dVar13) * 2.519842099789747;
      dVar11 = SQRT(dVar20);
      dVar10 = dVar11;
      if (dVar20 < 0.0) {
        dVar10 = sqrt(dVar20);
      }
      if (dVar20 < 0.0) {
        dVar11 = sqrt(dVar20);
      }
      dVar11 = dVar11 * dVar20;
      dVar22 = (1.0 / (dVar13 * dVar13)) * 1.5874010519681996 * dVar8 * dVar8 * 2.080083823051904;
      dVar8 = log(16.081979498692537 /
                  (dVar22 * 0.123235 + dVar11 * 0.204775 + dVar10 * 3.79785 + dVar20 * 0.8969) + 1.0
                 );
      dVar21 = (dVar12 + local_d8 + -2.0) * 1.9236610509315362;
      dVar14 = log(32.16395899738507 /
                   (dVar22 * 0.1562925 + dVar11 * 0.420775 + dVar10 * 7.05945 + dVar20 * 1.549425) +
                   1.0);
      dVar10 = log(29.608749977793437 /
                   (dVar22 * 0.1241775 + dVar11 * 0.1100325 + dVar10 * 5.1785 + dVar20 * 0.905775) +
                   1.0);
      dVar10 = dVar10 * (dVar20 * 0.0278125 + 1.0);
      pdVar1 = out->zk;
      if ((pdVar1 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        dVar8 = (dVar20 * 0.053425 + 1.0) * dVar8 * 0.0621814;
        lVar5 = (long)(p->dim).zk * sVar6;
        pdVar1[lVar5] =
             (dVar12 * 1.5874010519681996 * local_f8 * dVar13 * -0.09375 * dVar9 -
             local_d8 * 1.5874010519681996 * dVar35 * dVar13 * 0.09375 * dVar9) +
             (1.0 / (dVar22 * 0.25 + dVar20 * -0.225 + 3.2)) * 3.4602 *
             (dVar10 * 0.0197516734986138 * dVar21 +
             ((dVar10 * -0.0197516734986138 + dVar14 * -0.0310907 * (dVar20 * 0.05137 + 1.0) + dVar8
              ) * dVar21 *
              (1.0 / (dVar16 * dVar16 * dVar16 * dVar16)) * dVar17 * dVar17 * dVar17 * dVar17 -
             dVar8)) + pdVar1[lVar5];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_LDA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, xc_lda_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    if(p->nspin == XC_POLARIZED){
      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}